

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeImportTableGet(TranslateToFuzzReader *this)

{
  string_view target;
  Call *pCVar1;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_50;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  allocator_type local_29;
  
  if ((this->tableGetImportName).super_IString.str._M_str != (char *)0x0) {
    target = (this->tableGetImportName).super_IString.str;
    local_50 = make(this,(Type)0x2);
    __l._M_len = 1;
    __l._M_array = &local_50;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_48,__l,&local_29);
    pCVar1 = Builder::makeCall(&this->builder,(Name)target,&local_48,(Type)0x12,false);
    if (local_48.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return (Expression *)pCVar1;
  }
  __assert_fail("tableGetImportName",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4e2,"Expression *wasm::TranslateToFuzzReader::makeImportTableGet()");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportTableGet() {
  assert(tableGetImportName);
  return builder.makeCall(
    tableGetImportName, {make(Type::i32)}, Type(HeapType::func, Nullable));
}